

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * dialogName(void)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *lDialogName;
  char *local_8;
  
  local_8 = dialogNameOnly();
  sVar2 = strlen(local_8);
  if ((sVar2 == 0) ||
     ((iVar1 = isTerminalRunning(), iVar1 == 0 && (pcVar3 = terminalName(), pcVar3 == (char *)0x0)))
     ) {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

static char * dialogName(void)
{
    char * lDialogName ;
    lDialogName = dialogNameOnly( ) ;
        if ( strlen(lDialogName) && ( isTerminalRunning() || terminalName() ) )
        {
                return lDialogName ;
        }
        else
        {
                return NULL ;
        }
}